

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O3

ssize_t xz_filter_read(archive_read_filter *self,void **p)

{
  char cVar1;
  undefined8 *puVar2;
  long lVar3;
  int iVar4;
  undefined4 uVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uchar props [5];
  ssize_t avail_in;
  lzma_filter filters [2];
  undefined1 local_6d;
  int local_6c;
  long local_68;
  void **local_60;
  undefined8 local_58;
  void *local_50;
  undefined8 local_48;
  undefined8 local_40;
  ssize_t local_38;
  
  puVar2 = (undefined8 *)self->data;
  local_60 = p;
  do {
    pvVar7 = (void *)puVar2[0x11];
    puVar2[3] = pvVar7;
    puVar2[4] = puVar2[0x12];
    lVar3 = puVar2[0x15];
    lVar8 = lVar3;
    pvVar6 = pvVar7;
    if (puVar2[0x12] != 0) {
      cVar1 = *(char *)(puVar2 + 0x14);
      while (cVar1 == '\0') {
        if (*(char *)((long)puVar2 + 0xa1) == '\0') {
          pvVar7 = self->data;
          pvVar6 = __archive_read_filter_ahead(self->upstream,6,&local_38);
          if (pvVar6 == (void *)0x0) {
            return -0x1e;
          }
          *(undefined1 *)((long)pvVar7 + 0xa2) = *(undefined1 *)((long)pvVar6 + 4);
          local_6d = 0x5d;
          uVar9 = *(byte *)((long)pvVar6 + 5) & 0x1f;
          if (uVar9 - 0x1e < 0xffffffee) {
            return -0x1e;
          }
          uVar10 = 1 << (sbyte)uVar9;
          local_6c = (uint)(*(byte *)((long)pvVar6 + 5) >> 5) * (uVar10 >> 4);
          if (uVar9 < 0xd) {
            local_6c = 0;
          }
          local_6c = uVar10 - local_6c;
          __archive_read_filter_consume(self->upstream,6);
          *(undefined8 *)((long)pvVar7 + 0xa8) = 6;
          local_58 = 0x4000000000000001;
          local_50 = (void *)0x0;
          local_48 = 0xffffffffffffffff;
          local_40 = 0;
          iVar4 = lzma_properties_decode(&local_58,0,&local_6d,5);
          if (iVar4 != 0) goto LAB_0011c993;
          iVar4 = lzma_raw_decoder(pvVar7,&local_58);
          free(local_50);
          if (iVar4 != 0) goto LAB_0011c993;
          *(undefined1 *)((long)puVar2 + 0xa1) = 1;
        }
        pvVar7 = __archive_read_filter_ahead(self->upstream,1,&local_68);
        *puVar2 = pvVar7;
        if (local_68 < 0 && pvVar7 == (void *)0x0) {
          archive_set_error(&self->archive->archive,-1,"truncated input");
          return -0x1e;
        }
        puVar2[1] = local_68;
        iVar4 = lzma_code(puVar2,(local_68 == 0) * '\x03');
        if (iVar4 != 0) {
          if (iVar4 != 1) {
LAB_0011c993:
            set_error(self,iVar4);
            return -0x1e;
          }
          *(undefined1 *)(puVar2 + 0x14) = 1;
        }
        __archive_read_filter_consume(self->upstream,local_68 - puVar2[1]);
        lVar8 = (local_68 - puVar2[1]) + puVar2[0x15];
        puVar2[0x15] = lVar8;
        if (puVar2[4] == 0) break;
        cVar1 = *(char *)(puVar2 + 0x14);
      }
      pvVar6 = (void *)puVar2[3];
      pvVar7 = (void *)puVar2[0x11];
    }
    lVar11 = (long)pvVar6 - (long)pvVar7;
    puVar2[0x13] = puVar2[0x13] + lVar11;
    puVar2[0x16] = puVar2[0x16] + lVar11;
    if (lVar11 != 0) {
      *local_60 = pvVar7;
      if (self->code != 9) {
        return lVar11;
      }
      uVar5 = lzma_crc32(puVar2[0x11],lVar11,*(undefined4 *)((long)puVar2 + 0xa4));
      *(undefined4 *)((long)puVar2 + 0xa4) = uVar5;
      if (*(char *)(puVar2 + 0x14) != '\0') {
        iVar4 = lzip_tail(self);
        if (iVar4 != 0) {
          return (long)iVar4;
        }
        return lVar11;
      }
      return lVar11;
    }
    if (((lVar3 == lVar8) || (self->code != 9)) || (*(char *)(puVar2 + 0x14) == '\0')) break;
    iVar4 = lzip_tail(self);
    if (iVar4 != 0) {
      return (long)iVar4;
    }
  } while (*(char *)(puVar2 + 0x14) == '\0');
  *local_60 = (void *)0x0;
  return 0;
}

Assistant:

static ssize_t
xz_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int64_t member_in;
	int ret;

	state = (struct private_data *)self->data;

	redo:
	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;
	member_in = state->member_in;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		if (!state->in_stream) {
			/*
			 * Initialize liblzma for lzip
			 */
			ret = lzip_init(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			state->in_stream = 1;
		}
		state->stream.next_in =
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL && avail_in < 0) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = avail_in;

		/* Decompress as much as we can in one pass. */
		ret = lzma_code(&(state->stream),
		    (state->stream.avail_in == 0)? LZMA_FINISH: LZMA_RUN);
		switch (ret) {
		case LZMA_STREAM_END: /* Found end of stream. */
			state->eof = 1;
			/* FALL THROUGH */
		case LZMA_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			state->member_in +=
			    avail_in - state->stream.avail_in;
			break;
		default:
			set_error(self, ret);
			return (ARCHIVE_FATAL);
		}
	}

	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	state->member_out += decompressed;
	if (decompressed == 0) {
		if (member_in != state->member_in &&
		    self->code == ARCHIVE_FILTER_LZIP &&
		    state->eof) {
			ret = lzip_tail(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			if (!state->eof)
				goto redo;
		}
		*p = NULL;
	} else {
		*p = state->out_block;
		if (self->code == ARCHIVE_FILTER_LZIP) {
			state->crc32 = lzma_crc32(state->out_block,
			    decompressed, state->crc32);
			if (state->eof) {
				ret = lzip_tail(self);
				if (ret != ARCHIVE_OK)
					return (ret);
			}
		}
	}
	return (decompressed);
}